

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O2

bool __thiscall
ON_3dmObjectAttributes::IsInGroups(ON_3dmObjectAttributes *this,int group_count,int *group_list)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  ulong uVar6;
  
  piVar3 = (int *)0x0;
  if (group_list == (int *)0x0 || group_count < 1) {
LAB_003a15d8:
    return SUB81(piVar3,0);
  }
  uVar2 = (this->m_group).m_count;
  piVar5 = (this->m_group).m_a;
  if ((int)uVar2 < 1) {
    piVar5 = piVar3;
  }
  piVar4 = (int *)(ulong)uVar2;
  if ((int)uVar2 < 1) {
    piVar4 = piVar3;
  }
  do {
    if (piVar3 == piVar4) {
      return false;
    }
    uVar6 = 0;
    while ((uint)group_count != uVar6) {
      piVar1 = group_list + uVar6;
      uVar6 = uVar6 + 1;
      if (piVar5[(long)piVar3] == *piVar1) {
        piVar3 = (int *)0x1;
        goto LAB_003a15d8;
      }
    }
    piVar3 = (int *)((long)piVar3 + 1);
  } while( true );
}

Assistant:

bool ON_3dmObjectAttributes::IsInGroups( int group_count, const int* group_list ) const
{
  // returns true if object is in any of the groups in the list
  bool rc = false;
  if ( group_count > 0 && group_list ) {
    const int obj_group_count  = GroupCount();
    const int* obj_group_list = GroupList();
    // in practice these arrays will be very short and this search will be fast
    int i, j;
    for ( i = 0; i < obj_group_count; i++ ) for ( j = 0; j < group_count; j++ ) {
      if ( obj_group_list[i] == group_list[j] )
        return true;
    }
  }
  return rc;
}